

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::BufferCopyToBuffer::verify
          (BufferCopyToBuffer *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  size_type *psVar1;
  byte bVar2;
  VkCommandBuffer_s VVar3;
  long lVar4;
  DeviceInterface *vkd;
  VkDevice device;
  VkQueue queue;
  VkResult VVar5;
  uint uVar6;
  long *plVar7;
  undefined8 *puVar8;
  long *plVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong uVar12;
  long *local_398;
  undefined8 local_390;
  long local_388;
  undefined8 uStack_380;
  long *local_378;
  undefined8 local_370;
  long local_368;
  undefined8 uStack_360;
  string local_358;
  ulong *local_338;
  long local_330;
  ulong local_328;
  long lStack_320;
  ulong *local_318;
  long local_310;
  ulong local_308;
  long lStack_300;
  ulong *local_2f8;
  long local_2f0;
  ulong local_2e8;
  long lStack_2e0;
  Hex<8UL> local_2d8;
  long local_2d0;
  ulong local_2c8 [2];
  Hex<8UL> local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  long *local_298;
  long local_290;
  long local_288;
  undefined4 uStack_280;
  undefined4 uStack_27c;
  VkCommandBuffer local_278;
  DeviceInterface *pDStack_270;
  undefined4 local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  ulong *local_250;
  long local_248;
  ulong local_240 [2];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  ResultCollector *local_210;
  long *local_208 [2];
  long local_1f8 [2];
  Move<vk::VkCommandBuffer_s_*> local_1e8 [3];
  ios_base local_178 [272];
  VkBufferMemoryBarrier barrier;
  
  local_210 = *(ResultCollector **)(ctx + 8);
  lVar4 = *(long *)(ctx + 0x10);
  vkd = *(DeviceInterface **)(lVar4 + 8);
  device = *(VkDevice *)(lVar4 + 0x18);
  queue = *(VkQueue *)(lVar4 + 0x20);
  createBeginCommandBuffer
            (local_1e8,vkd,device,(VkCommandPool)*(deUint64 *)(lVar4 + 0x48),
             (VkCommandBufferLevel)tbs);
  local_268 = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device._0_4_;
  uStack_264 = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device._4_4_;
  uStack_260 = (undefined4)
               local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal;
  uStack_25c = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal.
               _4_4_;
  local_278 = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
  pDStack_270 = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface;
  barrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  barrier.pNext = (void *)0x0;
  barrier.srcAccessMask = 0x1000;
  barrier.dstAccessMask = 0x2000;
  barrier.srcQueueFamilyIndex = 0xffffffff;
  barrier.dstQueueFamilyIndex = 0xffffffff;
  barrier.buffer.m_internal =
       (this->m_dstBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal;
  barrier.offset = 0;
  barrier.size = 0xffffffffffffffff;
  (*vkd->_vptr_DeviceInterface[0x6d])
            (vkd,local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,0x4000,0,0
             ,0,1,&barrier,0,0);
  VVar5 = (*vkd->_vptr_DeviceInterface[0x4a])(vkd,local_278);
  ::vk::checkResult(VVar5,"vkd.endCommandBuffer(*commandBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x92f);
  queueRun(vkd,queue,local_278);
  VVar5 = (*vkd->_vptr_DeviceInterface[7])
                    (vkd,device,
                     (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.
                     m_internal,0,this->m_bufferSize,0,local_1e8);
  ::vk::checkResult(VVar5,"vkd.mapMemory(device, memory, 0, size, 0, &ptr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/memory/vktMemoryPipelineBarrierTests.cpp"
                    ,0x2b3);
  ::vk::invalidateMappedMemoryRange
            (vkd,device,
             (VkDeviceMemory)
             (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
             ,0,this->m_bufferSize);
  if (this->m_bufferSize != 0) {
    uVar12 = 0;
    do {
      if (((*(ulong *)(*(long *)(ctx + 0x30) + (uVar12 >> 6) * 8) >> (uVar12 & 0x3f) & 1) != 0) &&
         (local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object[uVar12] !=
          *(VkCommandBuffer_s *)(*(long *)(ctx + 0x18) + uVar12))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        plVar7 = (long *)std::__cxx11::string::append((char *)local_208);
        local_298 = &local_288;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_288 = *plVar9;
          uStack_280 = (undefined4)plVar7[3];
          uStack_27c = *(undefined4 *)((long)plVar7 + 0x1c);
        }
        else {
          local_288 = *plVar9;
          local_298 = (long *)*plVar7;
        }
        local_290 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        (*(this->super_CmdCommand)._vptr_CmdCommand[2])(this);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_298);
        local_230 = &local_220;
        plVar9 = plVar7 + 2;
        if ((long *)*plVar7 == plVar9) {
          local_220 = *plVar9;
          lStack_218 = plVar7[3];
        }
        else {
          local_220 = *plVar9;
          local_230 = (long *)*plVar7;
        }
        local_228 = plVar7[1];
        *plVar7 = (long)plVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_230);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_328 = *puVar10;
          lStack_320 = plVar7[3];
          local_338 = &local_328;
        }
        else {
          local_328 = *puVar10;
          local_338 = (ulong *)*plVar7;
        }
        local_330 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        bVar2 = *(byte *)(*(long *)(ctx + 0x18) + uVar12);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        local_2b8.value = (deUint64)(ulong)bVar2;
        tcu::Format::Hex<8UL>::toStream(&local_2b8,(ostream *)local_1e8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        uVar11 = 0xf;
        if (local_338 != &local_328) {
          uVar11 = local_328;
        }
        if (uVar11 < (ulong)(local_248 + local_330)) {
          uVar11 = 0xf;
          if (local_250 != local_240) {
            uVar11 = local_240[0];
          }
          if (uVar11 < (ulong)(local_248 + local_330)) goto LAB_006702e2;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_250,0,(char *)0x0,(ulong)local_338);
        }
        else {
LAB_006702e2:
          puVar8 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_338,(ulong)local_250);
        }
        local_398 = &local_388;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_388 = *plVar7;
          uStack_380 = puVar8[3];
        }
        else {
          local_388 = *plVar7;
          local_398 = (long *)*puVar8;
        }
        local_390 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_398);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_308 = *puVar10;
          lStack_300 = plVar7[3];
          local_318 = &local_308;
        }
        else {
          local_308 = *puVar10;
          local_318 = (ulong *)*plVar7;
        }
        local_310 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        VVar3 = local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object[uVar12];
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        local_2d8.value = (deUint64)(ulong)(byte)VVar3;
        tcu::Format::Hex<8UL>::toStream(&local_2d8,(ostream *)local_1e8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        uVar12 = 0xf;
        if (local_318 != &local_308) {
          uVar12 = local_308;
        }
        if (uVar12 < (ulong)(local_2b0 + local_310)) {
          uVar12 = 0xf;
          if ((ulong *)local_2b8.value != local_2a8) {
            uVar12 = local_2a8[0];
          }
          if (uVar12 < (ulong)(local_2b0 + local_310)) goto LAB_00670464;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_318);
        }
        else {
LAB_00670464:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_318,local_2b8.value)
          ;
        }
        local_378 = &local_368;
        plVar7 = puVar8 + 2;
        if ((long *)*puVar8 == plVar7) {
          local_368 = *plVar7;
          uStack_360 = puVar8[3];
        }
        else {
          local_368 = *plVar7;
          local_378 = (long *)*puVar8;
        }
        local_370 = puVar8[1];
        *puVar8 = plVar7;
        puVar8[1] = 0;
        *(undefined1 *)plVar7 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_378);
        puVar10 = (ulong *)(plVar7 + 2);
        if ((ulong *)*plVar7 == puVar10) {
          local_2e8 = *puVar10;
          lStack_2e0 = plVar7[3];
          local_2f8 = &local_2e8;
        }
        else {
          local_2e8 = *puVar10;
          local_2f8 = (ulong *)*plVar7;
        }
        local_2f0 = plVar7[1];
        *plVar7 = (long)puVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e8);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1e8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e8);
        std::ios_base::~ios_base(local_178);
        uVar12 = 0xf;
        if (local_2f8 != &local_2e8) {
          uVar12 = local_2e8;
        }
        if (uVar12 < (ulong)(local_2d0 + local_2f0)) {
          uVar12 = 0xf;
          if ((ulong *)local_2d8.value != local_2c8) {
            uVar12 = local_2c8[0];
          }
          if (uVar12 < (ulong)(local_2d0 + local_2f0)) goto LAB_006705dc;
          puVar8 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_2d8,0,(char *)0x0,(ulong)local_2f8);
        }
        else {
LAB_006705dc:
          puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2f8,local_2d8.value)
          ;
        }
        local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
        psVar1 = puVar8 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar1) {
          local_358.field_2._M_allocated_capacity = *psVar1;
          local_358.field_2._8_8_ = puVar8[3];
        }
        else {
          local_358.field_2._M_allocated_capacity = *psVar1;
          local_358._M_dataplus._M_p = (pointer)*puVar8;
        }
        local_358._M_string_length = puVar8[1];
        *puVar8 = psVar1;
        puVar8[1] = 0;
        *(undefined1 *)psVar1 = 0;
        tcu::ResultCollector::fail(local_210,&local_358);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_358._M_dataplus._M_p != &local_358.field_2) {
          operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
        }
        if ((ulong *)local_2d8.value != local_2c8) {
          operator_delete((void *)local_2d8.value,local_2c8[0] + 1);
        }
        if (local_2f8 != &local_2e8) {
          operator_delete(local_2f8,local_2e8 + 1);
        }
        if (local_378 != &local_368) {
          operator_delete(local_378,local_368 + 1);
        }
        if ((ulong *)local_2b8.value != local_2a8) {
          operator_delete((void *)local_2b8.value,local_2a8[0] + 1);
        }
        if (local_318 != &local_308) {
          operator_delete(local_318,local_308 + 1);
        }
        if (local_398 != &local_388) {
          operator_delete(local_398,local_388 + 1);
        }
        if (local_250 != local_240) {
          operator_delete(local_250,local_240[0] + 1);
        }
        if (local_338 != &local_328) {
          operator_delete(local_338,local_328 + 1);
        }
        if (local_230 != &local_220) {
          operator_delete(local_230,local_220 + 1);
        }
        if (local_298 != &local_288) {
          operator_delete(local_298,local_288 + 1);
        }
        if (local_208[0] != local_1f8) {
          operator_delete(local_208[0],local_1f8[0] + 1);
        }
        break;
      }
      uVar12 = uVar12 + 1;
    } while (this->m_bufferSize != uVar12);
  }
  (*vkd->_vptr_DeviceInterface[8])
            (vkd,device,
             (this->m_memory).super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal
            );
  if (local_278 != (VkCommandBuffer)0x0) {
    local_1e8[0].super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object = local_278;
    uVar6 = (*pDStack_270->_vptr_DeviceInterface[0x48])
                      (pDStack_270,CONCAT44(uStack_264,local_268),CONCAT44(uStack_25c,uStack_260),1)
    ;
    local_278 = (VkCommandBuffer)(ulong)uVar6;
  }
  return (int)local_278;
}

Assistant:

void BufferCopyToBuffer::verify (VerifyContext& context, size_t commandIndex)
{
	tcu::ResultCollector&					resultCollector	(context.getResultCollector());
	ReferenceMemory&						reference		(context.getReference());
	const vk::DeviceInterface&				vkd				= context.getContext().getDeviceInterface();
	const vk::VkDevice						device			= context.getContext().getDevice();
	const vk::VkQueue						queue			= context.getContext().getQueue();
	const vk::VkCommandPool					commandPool		= context.getContext().getCommandPool();
	const vk::Unique<vk::VkCommandBuffer>	commandBuffer	(createBeginCommandBuffer(vkd, device, commandPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));
	const vk::VkBufferMemoryBarrier			barrier			=
	{
		vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,
		DE_NULL,

		vk::VK_ACCESS_TRANSFER_WRITE_BIT,
		vk::VK_ACCESS_HOST_READ_BIT,

		VK_QUEUE_FAMILY_IGNORED,
		VK_QUEUE_FAMILY_IGNORED,
		*m_dstBuffer,
		0,
		VK_WHOLE_SIZE
	};

	vkd.cmdPipelineBarrier(*commandBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0, 0, (const vk::VkMemoryBarrier*)DE_NULL, 1, &barrier, 0, (const vk::VkImageMemoryBarrier*)DE_NULL);

	VK_CHECK(vkd.endCommandBuffer(*commandBuffer));
	queueRun(vkd, queue, *commandBuffer);

	{
		void* const	ptr		= mapMemory(vkd, device, *m_memory, m_bufferSize);
		bool		isOk	= true;

		vk::invalidateMappedMemoryRange(vkd, device, *m_memory, 0, m_bufferSize);

		{
			const deUint8* const data = (const deUint8*)ptr;

			for (size_t pos = 0; pos < (size_t)m_bufferSize; pos++)
			{
				if (reference.isDefined(pos))
				{
					if (data[pos] != reference.get(pos))
					{
						resultCollector.fail(
								de::toString(commandIndex) + ":" + getName()
								+ " Result differs from reference, Expected: "
								+ de::toString(tcu::toHex<8>(reference.get(pos)))
								+ ", Got: "
								+ de::toString(tcu::toHex<8>(data[pos]))
								+ ", At offset: "
								+ de::toString(pos));
						break;
					}
				}
			}
		}

		vkd.unmapMemory(device, *m_memory);

		if (!isOk)
			context.getLog() << TestLog::Message << commandIndex << ": Buffer copy to buffer verification failed" << TestLog::EndMessage;
	}
}